

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O3

RepeatedFieldAccessor * __thiscall
google::protobuf::Reflection::RepeatedFieldAccessor(Reflection *this,FieldDescriptor *field)

{
  FieldDescriptor FVar1;
  bool bVar2;
  int iVar3;
  LogMessage *pLVar4;
  RepeatedFieldAccessor *pRVar5;
  undefined1 *puVar6;
  FieldDescriptor *local_50;
  LogMessage local_48;
  
  if ((~(byte)field[1] & 0x60) != 0) {
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/message.cc"
               ,0x155);
    pLVar4 = internal::LogMessage::operator<<(&local_48,"CHECK failed: field->is_repeated(): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_50,pLVar4);
    internal::LogMessage::~LogMessage(&local_48);
  }
  if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
    local_48._0_8_ = FieldDescriptor::TypeOnceInit;
    local_50 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)&local_48,&local_50)
    ;
  }
  FVar1 = field[2];
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)FVar1 * 4)) {
  case 1:
  case 8:
    (anonymous_namespace)::
    GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<int>>();
    return (RepeatedFieldAccessor *)
           &anon_unknown_0::
            GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<int>_>::
            singleton;
  case 2:
    pRVar5 = (RepeatedFieldAccessor *)
             &(anonymous_namespace)::
              GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<long>>()::
              singleton;
    if ((anonymous_namespace)::
        GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<long>>()::singleton
        != '\0') {
      return pRVar5;
    }
    iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::
                                 GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<long>>()
                                 ::singleton);
    if (iVar3 == 0) {
      return pRVar5;
    }
    (anonymous_namespace)::
    GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<long>>()::singleton =
         &PTR_IsEmpty_004d6dd8;
    puVar6 = &(anonymous_namespace)::
              GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<long>>()::
              singleton;
    break;
  case 3:
    pRVar5 = (RepeatedFieldAccessor *)
             &(anonymous_namespace)::
              GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<unsigned_int>>()
              ::singleton;
    if ((anonymous_namespace)::
        GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<unsigned_int>>()::
        singleton != '\0') {
      return pRVar5;
    }
    iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::
                                 GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<unsigned_int>>()
                                 ::singleton);
    if (iVar3 == 0) {
      return pRVar5;
    }
    (anonymous_namespace)::
    GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<unsigned_int>>()::
    singleton = &PTR_IsEmpty_004d6d08;
    puVar6 = &(anonymous_namespace)::
              GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<unsigned_int>>()
              ::singleton;
    break;
  case 4:
    pRVar5 = (RepeatedFieldAccessor *)
             &(anonymous_namespace)::
              GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<unsigned_long>>()
              ::singleton;
    if ((anonymous_namespace)::
        GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<unsigned_long>>()::
        singleton != '\0') {
      return pRVar5;
    }
    iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::
                                 GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<unsigned_long>>()
                                 ::singleton);
    if (iVar3 == 0) {
      return pRVar5;
    }
    (anonymous_namespace)::
    GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<unsigned_long>>()::
    singleton = &PTR_IsEmpty_004d6ea8;
    puVar6 = &(anonymous_namespace)::
              GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<unsigned_long>>()
              ::singleton;
    break;
  case 5:
    pRVar5 = (RepeatedFieldAccessor *)
             &(anonymous_namespace)::
              GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<double>>()::
              singleton;
    if ((anonymous_namespace)::
        GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<double>>()::
        singleton != '\0') {
      return pRVar5;
    }
    iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::
                                 GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<double>>()
                                 ::singleton);
    if (iVar3 == 0) {
      return pRVar5;
    }
    (anonymous_namespace)::
    GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<double>>()::singleton =
         &PTR_IsEmpty_004d7048;
    puVar6 = &(anonymous_namespace)::
              GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<double>>()::
              singleton;
    break;
  case 6:
    pRVar5 = (RepeatedFieldAccessor *)
             &(anonymous_namespace)::
              GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<float>>()::
              singleton;
    if ((anonymous_namespace)::
        GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<float>>()::singleton
        != '\0') {
      return pRVar5;
    }
    iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::
                                 GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<float>>()
                                 ::singleton);
    if (iVar3 == 0) {
      return pRVar5;
    }
    (anonymous_namespace)::
    GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<float>>()::singleton =
         &PTR_IsEmpty_004d6f78;
    puVar6 = &(anonymous_namespace)::
              GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<float>>()::
              singleton;
    break;
  case 7:
    pRVar5 = (RepeatedFieldAccessor *)
             &(anonymous_namespace)::
              GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<bool>>()::
              singleton;
    if ((anonymous_namespace)::
        GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<bool>>()::singleton
        != '\0') {
      return pRVar5;
    }
    iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::
                                 GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<bool>>()
                                 ::singleton);
    if (iVar3 == 0) {
      return pRVar5;
    }
    (anonymous_namespace)::
    GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<bool>>()::singleton =
         &PTR_IsEmpty_004d7118;
    puVar6 = &(anonymous_namespace)::
              GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<bool>>()::
              singleton;
    break;
  case 9:
    pRVar5 = (RepeatedFieldAccessor *)
             &(anonymous_namespace)::
              GetSingleton<google::protobuf::internal::RepeatedPtrFieldStringAccessor>()::singleton;
    if ((anonymous_namespace)::
        GetSingleton<google::protobuf::internal::RepeatedPtrFieldStringAccessor>()::singleton !=
        '\0') {
      return pRVar5;
    }
    iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::
                                 GetSingleton<google::protobuf::internal::RepeatedPtrFieldStringAccessor>()
                                 ::singleton);
    if (iVar3 == 0) {
      return pRVar5;
    }
    (anonymous_namespace)::
    GetSingleton<google::protobuf::internal::RepeatedPtrFieldStringAccessor>()::singleton =
         &PTR_IsEmpty_004d71e8;
    puVar6 = &(anonymous_namespace)::
              GetSingleton<google::protobuf::internal::RepeatedPtrFieldStringAccessor>()::singleton;
    break;
  case 10:
    if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
      local_48._0_8_ = FieldDescriptor::TypeOnceInit;
      local_50 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)&local_48,
                 &local_50);
      FVar1 = field[2];
    }
    if ((FVar1 == (FieldDescriptor)0xb) &&
       (bVar2 = FieldDescriptor::is_map_message_type(field), bVar2)) {
      pRVar5 = (RepeatedFieldAccessor *)
               &(anonymous_namespace)::GetSingleton<google::protobuf::internal::MapFieldAccessor>()
                ::singleton;
      if ((anonymous_namespace)::GetSingleton<google::protobuf::internal::MapFieldAccessor>()::
          singleton != '\0') {
        return pRVar5;
      }
      iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   GetSingleton<google::protobuf::internal::MapFieldAccessor>()::
                                   singleton);
      if (iVar3 == 0) {
        return pRVar5;
      }
      (anonymous_namespace)::GetSingleton<google::protobuf::internal::MapFieldAccessor>()::singleton
           = &PTR_IsEmpty_004d72c0;
      puVar6 = &(anonymous_namespace)::GetSingleton<google::protobuf::internal::MapFieldAccessor>()
                ::singleton;
    }
    else {
      pRVar5 = (RepeatedFieldAccessor *)
               &(anonymous_namespace)::
                GetSingleton<google::protobuf::internal::RepeatedPtrFieldMessageAccessor>()::
                singleton;
      if ((anonymous_namespace)::
          GetSingleton<google::protobuf::internal::RepeatedPtrFieldMessageAccessor>()::singleton !=
          '\0') {
        return pRVar5;
      }
      iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   GetSingleton<google::protobuf::internal::RepeatedPtrFieldMessageAccessor>()
                                   ::singleton);
      if (iVar3 == 0) {
        return pRVar5;
      }
      (anonymous_namespace)::
      GetSingleton<google::protobuf::internal::RepeatedPtrFieldMessageAccessor>()::singleton =
           &PTR_IsEmpty_004d7390;
      puVar6 = &(anonymous_namespace)::
                GetSingleton<google::protobuf::internal::RepeatedPtrFieldMessageAccessor>()::
                singleton;
    }
    break;
  default:
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/message.cc"
               ,0x171);
    pLVar4 = internal::LogMessage::operator<<(&local_48,"Should not reach here.");
    internal::LogFinisher::operator=((LogFinisher *)&local_50,pLVar4);
    internal::LogMessage::~LogMessage(&local_48);
    return (RepeatedFieldAccessor *)0x0;
  }
  __cxa_guard_release(puVar6);
  return pRVar5;
}

Assistant:

const internal::RepeatedFieldAccessor* Reflection::RepeatedFieldAccessor(
    const FieldDescriptor* field) const {
  GOOGLE_CHECK(field->is_repeated());
  switch (field->cpp_type()) {
#define HANDLE_PRIMITIVE_TYPE(TYPE, type) \
  case FieldDescriptor::CPPTYPE_##TYPE:   \
    return GetSingleton<internal::RepeatedFieldPrimitiveAccessor<type> >();
    HANDLE_PRIMITIVE_TYPE(INT32, int32_t)
    HANDLE_PRIMITIVE_TYPE(UINT32, uint32_t)
    HANDLE_PRIMITIVE_TYPE(INT64, int64_t)
    HANDLE_PRIMITIVE_TYPE(UINT64, uint64_t)
    HANDLE_PRIMITIVE_TYPE(FLOAT, float)
    HANDLE_PRIMITIVE_TYPE(DOUBLE, double)
    HANDLE_PRIMITIVE_TYPE(BOOL, bool)
    HANDLE_PRIMITIVE_TYPE(ENUM, int32_t)
#undef HANDLE_PRIMITIVE_TYPE
    case FieldDescriptor::CPPTYPE_STRING:
      switch (field->options().ctype()) {
        default:
        case FieldOptions::STRING:
          return GetSingleton<internal::RepeatedPtrFieldStringAccessor>();
      }
      break;
    case FieldDescriptor::CPPTYPE_MESSAGE:
      if (field->is_map()) {
        return GetSingleton<internal::MapFieldAccessor>();
      } else {
        return GetSingleton<internal::RepeatedPtrFieldMessageAccessor>();
      }
  }
  GOOGLE_LOG(FATAL) << "Should not reach here.";
  return nullptr;
}